

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Remove_Module(FT_Library library,FT_Module module)

{
  uint uVar1;
  FT_Memory pFVar2;
  FT_Module_Class *pFVar3;
  FT_Library library_00;
  FT_Memory pFVar4;
  FT_ListNode pFVar5;
  FT_ListNode pFVar6;
  FT_ListNode pFVar7;
  FT_Module_Class *pFVar8;
  FT_Module *ppFVar9;
  FT_ListRec *pFVar10;
  FT_ListNode pFVar11;
  FT_Renderer_conflict render;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (module != (FT_Module)0x0) {
    uVar1 = library->num_modules;
    for (ppFVar9 = library->modules; ppFVar9 < library->modules + uVar1; ppFVar9 = ppFVar9 + 1) {
      if (*ppFVar9 == module) {
        library->num_modules = uVar1 - 1;
        for (; ppFVar9 < library->modules + ((ulong)uVar1 - 1); ppFVar9 = ppFVar9 + 1) {
          *ppFVar9 = ppFVar9[1];
        }
        library->modules[(ulong)uVar1 - 1] = (FT_Module)0x0;
        pFVar2 = module->memory;
        pFVar3 = module->clazz;
        library_00 = module->library;
        pFVar8 = pFVar3;
        if (library_00 != (FT_Library)0x0) {
          if (library_00->auto_hinter == module) {
            library_00->auto_hinter = (FT_Module)0x0;
          }
          if ((pFVar3->module_flags & 2) != 0) {
            pFVar4 = library_00->memory;
            pFVar7 = FT_List_Find(&library_00->renderers,module);
            if (pFVar7 != (FT_ListNode)0x0) {
              if (module[4].library != (FT_Library)0x0) {
                (**(code **)((long)module[1].clazz[1].module_interface + 0x28))();
              }
              pFVar5 = pFVar7->prev;
              pFVar6 = pFVar7->next;
              pFVar10 = (FT_ListRec *)&pFVar5->next;
              if (pFVar5 == (FT_ListNode)0x0) {
                pFVar10 = &library_00->renderers;
              }
              pFVar10->head = pFVar6;
              pFVar11 = (FT_ListNode)&(library_00->renderers).tail;
              if (pFVar6 != (FT_ListNode)0x0) {
                pFVar11 = pFVar6;
              }
              pFVar11->prev = pFVar5;
              (*pFVar4->free)(pFVar4,pFVar7);
              ft_set_current_renderer(library_00);
              pFVar8 = module->clazz;
            }
          }
        }
        if ((pFVar8->module_flags & 1) != 0) {
          FT_List_Finalize((FT_List)&module[1].library,destroy_face,module->memory,module);
        }
        if (pFVar3->module_done != (FT_Module_Destructor)0x0) {
          (*pFVar3->module_done)(module);
        }
        (*pFVar2->free)(pFVar2,module);
        return 0;
      }
    }
  }
  return 0x22;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Remove_Module( FT_Library  library,
                    FT_Module   module )
  {
    /* try to find the module from the table, then remove it from there */

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( module )
    {
      FT_Module*  cur   = library->modules;
      FT_Module*  limit = cur + library->num_modules;


      for ( ; cur < limit; cur++ )
      {
        if ( cur[0] == module )
        {
          /* remove it from the table */
          library->num_modules--;
          limit--;
          while ( cur < limit )
          {
            cur[0] = cur[1];
            cur++;
          }
          limit[0] = NULL;

          /* destroy the module */
          Destroy_Module( module );

          return FT_Err_Ok;
        }
      }
    }
    return FT_THROW( Invalid_Driver_Handle );
  }